

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O1

string * __thiscall
pbrt::BVHLightSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,BVHLightSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pstd::vector<pbrt::LightBVHNode,pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>>const&>
            (__return_storage_ptr__,"[ BVHLightSampler nodes: %s ]",&this->nodes);
  return __return_storage_ptr__;
}

Assistant:

std::string BVHLightSampler::ToString() const {
    return StringPrintf("[ BVHLightSampler nodes: %s ]", nodes);
}